

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::DebugCommand(UCIAdapter *this,char *params)

{
  ChessEngine *this_00;
  bool bVar1;
  Output *pOVar2;
  char *local_48;
  Output local_40;
  Output local_38 [3];
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    pOVar2 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    Output::operator<<(pOVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              token::Debug_abi_cxx11_);
    Output::~Output(&local_20);
    Output::Output(local_38,InfoPrefix);
    Output::operator<<(local_38,(char (*) [19])"Toggle debug mode.");
    Output::~Output(local_38);
  }
  else {
    this_00 = this->engine;
    bVar1 = ChessEngine::IsDebugOn(this_00);
    ChessEngine::SetDebug(this_00,!bVar1);
    Output::Output(&local_40,InfoPrefix);
    pOVar2 = Output::operator<<(&local_40,(char (*) [7])"debug ");
    bVar1 = ChessEngine::IsDebugOn(this->engine);
    local_48 = "off";
    if (bVar1) {
      local_48 = "on";
    }
    Output::operator<<(pOVar2,&local_48);
    Output::~Output(&local_40);
  }
  return;
}

Assistant:

void UCIAdapter::DebugCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Debug;
    Output() << "Toggle debug mode.";
    return;
  }

  engine->SetDebug(!engine->IsDebugOn());
  Output() << "debug " << (engine->IsDebugOn() ? "on" : "off");
}